

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqComms::queue_rx_function(ZmqComms *this)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  pollfd __n;
  void *pvVar6;
  reference pvVar7;
  CommsInterface *pCVar8;
  size_t in_RCX;
  size_t __n_00;
  undefined1 extraout_DL;
  int __timeout;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar9;
  string *__rep;
  CommsInterface *in_RDI;
  int __flags;
  undefined8 in_R8;
  undefined8 uVar10;
  int status_2;
  int status_1;
  int status;
  message_t msg_2;
  int rc_1;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  bool bindsuccess;
  error_t *ze;
  int cnt;
  bool notConnected;
  message_t msg_1;
  int rc;
  pollitem_t poller_1;
  string str;
  ActionMessage term;
  socket_t brokerReqTerm;
  bool bindsuccess_1;
  ActionMessage M;
  message_t msg;
  socket_t repSocket;
  error_t *e;
  string controlsockString;
  socket_t controlSocket;
  socket_t pullSocket;
  shared_ptr<ZmqContextManager> ctx;
  undefined4 in_stack_fffffffffffff638;
  int in_stack_fffffffffffff63c;
  undefined1 uVar11;
  undefined4 in_stack_fffffffffffff640;
  memory_order in_stack_fffffffffffff644;
  int in_stack_fffffffffffff648;
  ConnectionStatus in_stack_fffffffffffff64c;
  CommsInterface *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff658;
  action_t in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  ActionMessage *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  ActionMessage *in_stack_fffffffffffff698;
  undefined8 in_stack_fffffffffffff6a0;
  string *in_stack_fffffffffffff6a8;
  CommsInterface *in_stack_fffffffffffff6b0;
  milliseconds in_stack_fffffffffffff6b8;
  allocator<char> *paVar12;
  milliseconds in_stack_fffffffffffff6c0;
  milliseconds timeout;
  undefined1 local_7e0 [16];
  message_t *in_stack_fffffffffffff830;
  ZmqComms *in_stack_fffffffffffff838;
  int local_79c;
  nfds_t local_798;
  int local_790;
  allocator<zmq_pollitem_t> local_789;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> local_788 [2];
  allocator<char> local_749 [33];
  socket_t *in_stack_fffffffffffff8d8;
  message_t *in_stack_fffffffffffff8e0;
  ZmqComms *in_stack_fffffffffffff8e8;
  allocator<char> local_6b9 [65];
  __sv_type local_678;
  ActionMessage *in_stack_fffffffffffffa68;
  allocator<char> local_559 [65];
  __sv_type local_518;
  undefined8 local_508;
  rep local_500;
  int local_4f4;
  duration<long,std::ratio<1l,1000l>> local_4f0 [12];
  undefined4 local_4e4;
  int local_4cc;
  byte local_4c5;
  undefined1 local_4c4 [12];
  ssize_t local_4b8;
  undefined1 local_4a8 [64];
  rep local_468;
  int local_45c;
  pollfd local_458;
  undefined2 local_44c;
  undefined1 local_448 [36];
  undefined4 local_424;
  undefined1 local_370 [36];
  undefined4 local_34c;
  socket_t local_348 [2];
  undefined8 local_328;
  size_t local_320;
  byte local_312;
  allocator<char> local_311 [97];
  __sv_type local_2b0;
  int local_29c;
  size_t local_1e8;
  undefined1 local_1d8 [68];
  undefined4 local_194;
  socket_t local_190;
  undefined4 local_17c;
  memory_order local_178;
  allocator<char> local_111 [161];
  socket_t local_70;
  undefined4 local_5c;
  socket_t local_58 [5];
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff650);
  ZmqContextManager::getContextPointer(in_stack_fffffffffffff6a8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4d1555);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d155d);
  zmq::socket_t::socket_t
            ((socket_t *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             (context_t *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
             (int)((ulong)in_stack_fffffffffffff650 >> 0x20));
  local_5c = 200;
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             in_stack_fffffffffffff63c,(int *)0x4d15a8);
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4d15b7);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d15bf);
  zmq::socket_t::socket_t
            ((socket_t *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             (context_t *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
             (int)((ulong)in_stack_fffffffffffff650 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff680,
             (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (char)(in_stack_fffffffffffff644 >> 0x18));
  CommsInterface::getRandomID_abi_cxx11_(in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (char *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::allocator<char>::~allocator(local_111);
  pcVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d16f9);
  zmq::detail::socket_base::bind(&local_70.super_socket_base,(int)pcVar4,__addr,(socklen_t)in_RCX);
  local_17c = 200;
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             in_stack_fffffffffffff63c,(int *)0x4d1a0f);
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4d1a1e);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d1a26);
  zmq::socket_t::socket_t
            ((socket_t *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             (context_t *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
             (int)((ulong)in_stack_fffffffffffff650 >> 0x20));
  if ((in_RDI->serverMode & 1U) != 0) {
    local_194 = 500;
    zmq::detail::socket_base::setsockopt<int>
              ((socket_base *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               in_stack_fffffffffffff63c,(int *)0x4d1a82);
  }
  do {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    iVar3 = (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
    if (_Var2 != -1) {
      if ((in_RDI->serverMode & 1U) == 0) goto LAB_004d2cb5;
      iVar9 = (int)in_RDI + 0xf0;
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648)
                );
      __n_00 = (in_RDI->connectionTimeout).__r;
      local_328 = 200;
      __flags = 200;
      local_320 = __n_00;
      local_312 = bindzmqSocket((socket_t *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
                                (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                                in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
      iVar3 = (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
      if ((bool)local_312) goto LAB_004d2cb5;
      if ((in_RDI[1].field_0xd & 1) != 0) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff650,
                   (char *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        message_00._M_str = (char *)in_stack_fffffffffffff6c0.__r;
        message_00._M_len = in_stack_fffffffffffff6b8.__r;
        CommsInterface::logWarning(in_stack_fffffffffffff6b0,message_00);
        std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4d1fcc);
        ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d1fd4);
        zmq::socket_t::socket_t
                  ((socket_t *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                   (context_t *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                   (int)((ulong)in_stack_fffffffffffff650 >> 0x20));
        local_34c = 0x32;
        iVar3 = 0x11;
        zmq::detail::socket_base::setsockopt<int>
                  ((socket_base *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                   in_stack_fffffffffffff63c,(int *)0x4d201f);
        zmq::socket_t::close(&local_190,iVar3);
        std::__atomic_base::operator_cast_to_int
                  ((__atomic_base<int> *)
                   CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        gmlc::networking::makePortAddress
                  ((string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   in_stack_fffffffffffff674);
        zmq::detail::socket_base::connect
                  (&local_348[0].super_socket_base,(int)local_370,__addr_00,(socklen_t)__n_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                   in_stack_fffffffffffff65c);
        local_424 = 0x8f;
        SmallBuffer::operator=
                  ((SmallBuffer *)in_stack_fffffffffffff668,
                   (char (*) [33])CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
        if ((in_RDI->useJsonSerialization & 1U) == 0) {
          ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff698);
        }
        else {
          ActionMessage::to_json_string_abi_cxx11_(in_stack_fffffffffffffa68);
        }
        zmq::detail::socket_base::send
                  (&local_348[0].super_socket_base,(int)local_448,(void *)0x0,__n_00,__flags);
        __n = (pollfd)zmq::socket_t::operator_cast_to_void_(local_348);
        local_44c = 1;
        local_468 = (in_RDI->connectionTimeout).__r;
        __rep = (string *)0x1;
        local_458 = __n;
        local_45c = zmq::poll(&local_458,1,(int)local_468);
        if (local_45c == 0) {
          zmq::socket_t::close(local_348,(int)__rep);
        }
        else {
          zmq::message_t::message_t
                    ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          iVar3 = (int)local_4a8;
          local_4b8 = zmq::detail::socket_base::recv
                                (&local_348[0].super_socket_base,iVar3,(void *)0x0,(size_t)__n,
                                 __flags);
          zmq::socket_t::close(local_348,iVar3);
          local_4c4._0_4_ = 0x41a;
          __rep = (string *)local_4c4;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)(local_4c4 + 4),(int *)__rep);
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff680);
          zmq::message_t::~message_t
                    ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        }
        local_4c5 = 1;
        local_4cc = 0;
        goto LAB_004d2316;
      }
      zmq::socket_t::close(local_58,iVar9);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffff63c >> 0x18);
      zmq::socket_t::close(&local_190,iVar9);
      CLI::std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (bool)uVar11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff680,
                 (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648)
                );
      gmlc::networking::makePortAddress
                ((string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 in_stack_fffffffffffff674);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
      local_678 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      message_02._M_str = (char *)in_stack_fffffffffffff6c0.__r;
      message_02._M_len = in_stack_fffffffffffff6b8.__r;
      CommsInterface::logError(in_stack_fffffffffffff6b0,message_02);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::allocator<char>::~allocator(local_6b9);
      CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
      local_178 = consume;
      break;
    }
    zmq::message_t::message_t
              ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    in_RCX = zmq::detail::socket_base::recv
                       (&local_70.super_socket_base,(int)local_1d8,(void *)0x0,in_RCX,(int)in_R8);
    local_1e8 = in_RCX;
    sVar5 = zmq::message_t::size
                      ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    if (sVar5 < 10) {
      local_178 = acquire;
    }
    else {
      zmq::message_t::data
                ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      zmq::message_t::size
                ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 in_stack_fffffffffffff668,
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
      bVar1 = isProtocolCommand((ActionMessage *)
                                CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      if (bVar1) {
        if (local_29c == 0x5ab) {
          NetworkCommsInterface::loadPortDefinitions
                    ((NetworkCommsInterface *)
                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                     in_stack_fffffffffffff668);
          goto LAB_004d1e58;
        }
        if (local_29c == 0xaa6) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff680,
                     (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                         (char *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          local_2b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          message._M_str = (char *)in_stack_fffffffffffff6c0.__r;
          message._M_len = in_stack_fffffffffffff6b8.__r;
          CommsInterface::logError(in_stack_fffffffffffff6b0,message);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
          std::allocator<char>::~allocator(local_311);
          CLI::std::atomic<bool>::operator=
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     SUB41((uint)in_stack_fffffffffffff63c >> 0x18,0));
          CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
          local_178 = consume;
        }
        else {
          bVar1 = SUB41((uint)in_stack_fffffffffffff63c >> 0x18,0);
          if ((local_29c == 0x9db) || (local_29c == 0x16570bf)) {
            CLI::std::atomic<bool>::operator=
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640)
                       ,bVar1);
            CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
            local_178 = consume;
          }
          else {
            if (local_29c != 0xa3f) goto LAB_004d1e58;
            CLI::std::atomic<bool>::operator=
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640)
                       ,bVar1);
            CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
            local_178 = consume;
          }
        }
      }
      else {
LAB_004d1e58:
        local_178 = relaxed;
      }
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    }
    zmq::message_t::~message_t
              ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  } while ((local_178 == relaxed) || (local_178 == acquire));
  goto LAB_004d33fb;
LAB_004d2316:
  iVar3 = (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
  iVar9 = (int)__rep;
  if ((local_4c5 & 1) != 0) {
    local_4cc = local_4cc + 1;
    std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4d2341);
    ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d2349);
    zmq::socket_t::socket_t
              ((socket_t *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (context_t *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
               (int)((ulong)in_stack_fffffffffffff650 >> 0x20));
    zmq::socket_t::operator=
              ((socket_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               (socket_t *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    zmq::socket_t::~socket_t((socket_t *)0x4d2391);
    if ((in_RDI->serverMode & 1U) != 0) {
      local_4e4 = 500;
      zmq::detail::socket_base::setsockopt<int>
                ((socket_base *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 in_stack_fffffffffffff63c,(int *)0x4d23c7);
    }
    local_4f4 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_4f0,&local_4f4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff680);
    __rep = &in_RDI->localTargetAddress;
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    local_500 = (in_RDI->connectionTimeout).__r;
    local_508 = 200;
    local_312 = bindzmqSocket((socket_t *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
                              (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                              in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    if ((bool)local_312) {
      local_4c5 = 0;
    }
    else {
      zmq::socket_t::close(&local_190,(int)__rep);
      iVar3 = (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
      iVar9 = (int)__rep;
      if (9 < local_4cc) goto LAB_004d24d0;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff680);
    }
    goto LAB_004d2316;
  }
LAB_004d24d0:
  bVar1 = (local_312 & 1) == 0;
  if (bVar1) {
    zmq::socket_t::close(local_58,iVar9);
    zmq::socket_t::close(&local_190,iVar9);
    CLI::std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               SUB41((uint)in_stack_fffffffffffff63c >> 0x18,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff680,
               (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    gmlc::networking::makePortAddress
              ((string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               in_stack_fffffffffffff674);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
    local_518 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    message_01._M_str = (char *)in_stack_fffffffffffff6c0.__r;
    message_01._M_len = in_stack_fffffffffffff6b8.__r;
    CommsInterface::logError(in_stack_fffffffffffff6b0,message_01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    std::allocator<char>::~allocator(local_559);
    CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
  }
  local_178 = (memory_order)bVar1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  if (local_178 == relaxed) {
    local_178 = relaxed;
  }
  zmq::socket_t::~socket_t((socket_t *)0x4d2aa1);
  if (local_178 == relaxed) {
LAB_004d2cb5:
    timeout.__r = (rep)&in_RDI->localTargetAddress;
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    iVar9 = (int)timeout.__r;
    uVar10 = 200;
    bVar1 = bindzmqSocket((socket_t *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,iVar3,
                          timeout,in_stack_fffffffffffff6b8);
    uVar11 = (undefined1)((uint)in_stack_fffffffffffff63c >> 0x18);
    if (bVar1) {
      std::allocator<zmq_pollitem_t>::allocator((allocator<zmq_pollitem_t> *)0x4d2f3d);
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::vector
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                 (allocator_type *)in_stack_fffffffffffff650);
      std::allocator<zmq_pollitem_t>::~allocator(&local_789);
      pvVar6 = zmq::socket_t::operator_cast_to_void_(&local_70);
      pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](local_788,0)
      ;
      pvVar7->socket = pvVar6;
      pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](local_788,0)
      ;
      pvVar7->events = 1;
      pvVar6 = zmq::socket_t::operator_cast_to_void_(local_58);
      pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](local_788,1)
      ;
      pvVar7->socket = pvVar6;
      pCVar8 = (CommsInterface *)
               std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[](local_788,1)
      ;
      *(short *)&pCVar8->field_0xc = 1;
      if ((in_RDI->serverMode & 1U) == 0) {
        std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize
                  ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                   CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                   CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      }
      else {
        pCVar8 = (CommsInterface *)zmq::socket_t::operator_cast_to_void_(&local_190);
        pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                           (local_788,2);
        pvVar7->socket = pCVar8;
        pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                           (local_788,2);
        pvVar7->events = 1;
      }
      CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
      do {
        while( true ) {
          local_79c = 1000;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&local_798,&local_79c);
          local_790 = zmq::poll((pollfd *)local_788,local_798,__timeout);
          if (0 < local_790) break;
LAB_004d3390:
          bVar1 = CLI::std::atomic<bool>::load
                            ((atomic<bool> *)
                             CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                             in_stack_fffffffffffff644);
          uVar11 = (undefined1)((uint)in_stack_fffffffffffff63c >> 0x18);
          if (bVar1) goto LAB_004d33b6;
        }
        zmq::message_t::message_t
                  ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                           (local_788,0);
        bVar1 = zmq::has_message(pvVar7);
        if (bVar1) {
          pCVar8 = (CommsInterface *)
                   zmq::detail::socket_base::recv
                             (&local_70.super_socket_base,(int)local_7e0,(void *)0x0,(size_t)pCVar8,
                              (int)uVar10);
          iVar3 = processIncomingMessage(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
          if (-1 < iVar3) goto LAB_004d31de;
          local_178 = acq_rel|release;
        }
        else {
LAB_004d31de:
          pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                             (local_788,1);
          bVar1 = zmq::has_message(pvVar7);
          if (bVar1) {
            pCVar8 = (CommsInterface *)
                     zmq::detail::socket_base::recv
                               (&local_58[0].super_socket_base,(int)local_7e0,(void *)0x0,
                                (size_t)pCVar8,(int)uVar10);
            iVar3 = processIncomingMessage(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
            if (iVar3 < 0) {
              local_178 = acq_rel|release;
              goto LAB_004d335f;
            }
          }
          if ((in_RDI->serverMode & 1U) != 0) {
            pvVar7 = std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                               (local_788,2);
            bVar1 = zmq::has_message(pvVar7);
            if (bVar1) {
              pCVar8 = (CommsInterface *)
                       zmq::detail::socket_base::recv
                                 (&local_190.super_socket_base,(int)local_7e0,(void *)0x0,
                                  (size_t)pCVar8,(int)uVar10);
              in_stack_fffffffffffff64c = CONCAT13(extraout_DL,(int3)in_stack_fffffffffffff64c);
              in_stack_fffffffffffff650 = pCVar8;
              in_stack_fffffffffffff648 =
                   replyToIncomingMessage
                             (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                              in_stack_fffffffffffff8d8);
              if (in_stack_fffffffffffff648 < 0) {
                local_178 = acq_rel|release;
              }
              else {
                local_178 = acq_rel|acquire;
              }
              goto LAB_004d335f;
            }
          }
          local_178 = relaxed;
        }
LAB_004d335f:
        zmq::message_t::~message_t
                  ((message_t *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        uVar11 = (undefined1)((uint)in_stack_fffffffffffff63c >> 0x18);
        in_stack_fffffffffffff644 = local_178;
        if (local_178 == relaxed) goto LAB_004d3390;
      } while (local_178 == (acq_rel|acquire));
LAB_004d33b6:
      CLI::std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (bool)uVar11);
      CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~vector
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                 in_stack_fffffffffffff650);
      local_178 = relaxed;
    }
    else {
      zmq::socket_t::close(local_58,iVar9);
      zmq::socket_t::close(&local_190,iVar9);
      CLI::std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (bool)uVar11);
      paVar12 = local_749;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff680,
                 (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
      pCVar8 = (CommsInterface *)&in_RDI->localTargetAddress;
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648)
                );
      gmlc::networking::makePortAddress
                ((string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 in_stack_fffffffffffff674);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      message_03._M_str = (char *)timeout.__r;
      message_03._M_len = (size_t)paVar12;
      CommsInterface::logError(pCVar8,message_03);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      std::allocator<char>::~allocator(local_749);
      CommsInterface::setRxStatus(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
      local_178 = consume;
    }
  }
LAB_004d33fb:
  zmq::socket_t::~socket_t((socket_t *)0x4d3408);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  zmq::socket_t::~socket_t((socket_t *)0x4d3422);
  zmq::socket_t::~socket_t((socket_t *)0x4d342f);
  std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4d343c);
  return;
}

Assistant:

void ZmqComms::queue_rx_function()
{
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::socket_t pullSocket(ctx->getBaseContext(), ZMQ_PULL);
    pullSocket.setsockopt(ZMQ_LINGER, 200);
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    try {
        controlSocket.bind(controlsockString.c_str());
    }
    catch (const zmq::error_t& e) {
        logError(std::string("binding error on internal comms socket:") + e.what());
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    controlSocket.setsockopt(ZMQ_LINGER, 200);

    zmq::socket_t repSocket(ctx->getBaseContext(), ZMQ_REP);
    if (serverMode) {
        repSocket.setsockopt(ZMQ_LINGER, 500);
    }

    while (PortNumber == -1) {
        zmq::message_t msg;
        controlSocket.recv(msg);
        if (msg.size() < 10) {
            continue;
        }
        ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

        if (isProtocolCommand(M)) {
            if (M.messageID == PORT_DEFINITIONS) {
                loadPortDefinitions(M);
            } else if (M.messageID == NAME_NOT_FOUND) {
                logError(std::string("broker name ") + brokerName +
                         " does not match broker connection");
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            } else if (M.messageID == DISCONNECT || M.messageID == CLOSE_RECEIVER) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                return;
            } else if (M.messageID == DISCONNECT_ERROR) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    if (serverMode) {
        auto bindsuccess =
            bindzmqSocket(repSocket, localTargetAddress, PortNumber + 1, connectionTimeout);
        if (!bindsuccess) {
            if (forceConnection) {
                logWarning("attempting to override existing broker and force network connection");
                zmq::socket_t brokerReqTerm(ctx->getBaseContext(), ZMQ_REQ);
                brokerReqTerm.setsockopt(ZMQ_LINGER, 50);
                try {
                    repSocket.close();
                    brokerReqTerm.connect(makePortAddress(localTargetAddress, PortNumber + 1));
                    ActionMessage term(CMD_GLOBAL_ERROR);
                    term.messageID = HELICS_ERROR_TERMINATED;
                    term.payload = "force termination for new broker";
                    auto str = (useJsonSerialization) ? term.to_json_string() : term.to_string();

                    brokerReqTerm.send(str);
                    zmq::pollitem_t poller;
                    poller.socket = static_cast<void*>(brokerReqTerm);
                    poller.events = ZMQ_POLLIN;
                    int rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc != 0) {
                        zmq::message_t msg;
                        brokerReqTerm.recv(msg);

                        brokerReqTerm.close();
                        // this sleep is to exceed the linger timeout on the port
                        std::this_thread::sleep_for(std::chrono::milliseconds(1050));
                    } else {
                        brokerReqTerm.close();
                    }
                    bool notConnected = true;
                    int cnt = 0;
                    while (notConnected) {
                        ++cnt;
                        repSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_REP);
                        if (serverMode) {
                            repSocket.setsockopt(ZMQ_LINGER, 500);
                        }
                        std::this_thread::sleep_for(std::chrono::milliseconds(100));
                        bindsuccess = bindzmqSocket(repSocket,
                                                    localTargetAddress,
                                                    PortNumber + 1,
                                                    connectionTimeout);
                        if (bindsuccess) {
                            notConnected = false;
                        } else {
                            repSocket.close();
                            if (cnt >= 10) {
                                break;
                            }
                            std::this_thread::sleep_for(connectionTimeout);
                        }
                    }

                    if (!bindsuccess) {
                        pullSocket.close();
                        repSocket.close();
                        disconnecting = true;
                        logError(
                            std::string("Unable to bind zmq reply even after force termination ") +
                            makePortAddress(localTargetAddress, PortNumber + 1));
                        setRxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
                catch (zmq::error_t& ze) {
                    pullSocket.close();
                    repSocket.close();
                    disconnecting = true;
                    logError(
                        std::string(
                            "unable to make connection with existing server, force override failed with error ") +
                        std::string(ze.what()) + " on " +
                        makePortAddress(localTargetAddress, PortNumber + 1));
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            } else {
                pullSocket.close();
                repSocket.close();
                disconnecting = true;
                logError(std::string("Unable to bind zmq reply socket giving up ") +
                         makePortAddress(localTargetAddress, PortNumber + 1));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    auto bindsuccess = bindzmqSocket(pullSocket, localTargetAddress, PortNumber, connectionTimeout);

    if (!bindsuccess) {
        pullSocket.close();
        repSocket.close();
        disconnecting = true;
        logError(std::string("Unable to bind zmq pull socket giving up ") +
                 makePortAddress(localTargetAddress, PortNumber));
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }

    std::vector<zmq::pollitem_t> poller(3);
    poller[0].socket = static_cast<void*>(controlSocket);
    poller[0].events = ZMQ_POLLIN;
    poller[1].socket = static_cast<void*>(pullSocket);
    poller[1].events = ZMQ_POLLIN;
    if (serverMode) {
        poller[2].socket = static_cast<void*>(repSocket);
        poller[2].events = ZMQ_POLLIN;
    } else {
        poller.resize(2);
    }
    setRxStatus(ConnectionStatus::CONNECTED);

    while (true) {
        auto rc = zmq::poll(poller, std::chrono::milliseconds(1000));
        if (rc > 0) {
            zmq::message_t msg;
            if (zmq::has_message(poller[0])) {
                controlSocket.recv(msg);

                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (zmq::has_message(poller[1])) {
                pullSocket.recv(msg);
                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (serverMode) {
                if (zmq::has_message(poller[2])) {
                    repSocket.recv(msg);
                    auto status = replyToIncomingMessage(msg, repSocket);
                    if (status < 0) {
                        break;
                    }
                    continue;
                }
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            break;
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}